

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O0

span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> __thiscall
slang::parsing::Parser::parsePathTerminals(Parser *this)

{
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar1;
  bool bVar2;
  int iVar3;
  undefined4 extraout_var;
  EVP_PKEY_CTX *src;
  size_t extraout_RDX;
  undefined8 *in_RDI;
  Token TVar4;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> results;
  SyntaxNode *in_stack_fffffffffffffed8;
  SmallVectorBase<slang::syntax::TokenOrSyntax> *in_stack_fffffffffffffee0;
  undefined6 in_stack_fffffffffffffee8;
  TokenKind in_stack_fffffffffffffeee;
  ParserBase *in_stack_fffffffffffffef0;
  undefined7 in_stack_ffffffffffffff00;
  bitmask<slang::parsing::detail::NameOptions> local_ac [7];
  SmallVectorBase<slang::syntax::TokenOrSyntax> local_90 [2];
  pointer local_10;
  __extent_storage<18446744073709551615UL> local_8;
  
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x5fa6b9);
  while( true ) {
    bitmask<slang::parsing::detail::NameOptions>::bitmask(local_ac,NoClassScope);
    parseName((Parser *)results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_,
              results.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._4_4_);
    slang::syntax::TokenOrSyntax::TokenOrSyntax
              ((TokenOrSyntax *)in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              (in_stack_fffffffffffffee0,(TokenOrSyntax *)in_stack_fffffffffffffed8);
    bVar2 = ParserBase::peek(in_stack_fffffffffffffef0,in_stack_fffffffffffffeee);
    if (!bVar2) break;
    TVar4 = ParserBase::consume((ParserBase *)CONCAT17(bVar2,in_stack_ffffffffffffff00));
    in_stack_fffffffffffffef0 = (ParserBase *)TVar4.info;
    TVar4.rawLen._2_2_ = in_stack_fffffffffffffeee;
    TVar4._0_6_ = in_stack_fffffffffffffee8;
    TVar4.info = (Info *)in_stack_fffffffffffffef0;
    slang::syntax::TokenOrSyntax::TokenOrSyntax((TokenOrSyntax *)in_stack_fffffffffffffee0,TVar4);
    SmallVectorBase<slang::syntax::TokenOrSyntax>::push_back
              (in_stack_fffffffffffffee0,(TokenOrSyntax *)in_stack_fffffffffffffed8);
  }
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy(local_90,(EVP_PKEY_CTX *)*in_RDI,src);
  local_10 = (pointer)CONCAT26((short)((uint)extraout_var >> 0x10),
                               (int6)CONCAT44(extraout_var,iVar3));
  local_8._M_extent_value = extraout_RDX;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL>::~SmallVector
            ((SmallVector<slang::syntax::TokenOrSyntax,_4UL> *)0x5fa7ec);
  sVar1._M_extent._M_extent_value = local_8._M_extent_value;
  sVar1._M_ptr = local_10;
  return sVar1;
}

Assistant:

std::span<TokenOrSyntax> Parser::parsePathTerminals() {
    SmallVector<TokenOrSyntax, 4> results;
    while (true) {
        results.push_back(&parseName(NameOptions::NoClassScope));
        if (!peek(TokenKind::Comma))
            break;

        results.push_back(consume());
    }

    return results.copy(alloc);
}